

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

ON_UUID __thiscall ONX_Model::CurrentDimensionStyleId(ONX_Model *this)

{
  bool bVar1;
  ON_DimStyle *this_00;
  ON_UUID *pOVar2;
  uchar extraout_RDX [8];
  uchar auVar3 [8];
  ON_UUID *pOVar4;
  undefined8 uVar5;
  ON_UUID OVar6;
  ON_UUID id_00;
  ON_UUID component_model_id;
  ON_UUID id;
  ON_ModelComponentReference cr;
  
  pOVar4 = &id;
  id = ON_3dmSettings::CurrentDimensionStyleId(&this->m_settings);
  bVar1 = ::operator==(&ON_nil_uuid,&id);
  auVar3 = id.Data4;
  uVar5 = id._0_8_;
  if (!bVar1) {
    id_00.Data4[0] = extraout_RDX[0];
    id_00.Data4[1] = extraout_RDX[1];
    id_00.Data4[2] = extraout_RDX[2];
    id_00.Data4[3] = extraout_RDX[3];
    id_00.Data4[4] = extraout_RDX[4];
    id_00.Data4[5] = extraout_RDX[5];
    id_00.Data4[6] = extraout_RDX[6];
    id_00.Data4[7] = extraout_RDX[7];
    id_00._0_8_ = id.Data4;
    this_00 = ON_DimStyle::SystemDimstyleFromId((ON_DimStyle *)id._0_8_,id_00);
    pOVar2 = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
    bVar1 = ::operator==(&id,pOVar2);
    if (bVar1) {
      auVar3 = id.Data4;
      uVar5 = id._0_8_;
    }
    else {
      component_model_id.Data4 = (uchar  [8])id._0_8_;
      component_model_id.Data1 = 8;
      component_model_id.Data2 = 0;
      component_model_id.Data3 = 0;
      ComponentFromId((ONX_Model *)&cr,(Type)this,component_model_id);
      bVar1 = ON_ModelComponentReference::IsEmpty(&cr);
      pOVar2 = &ON_nil_uuid;
      if (!bVar1) {
        pOVar2 = &id;
      }
      auVar3 = *&pOVar2->Data4;
      if (bVar1) {
        pOVar4 = &ON_nil_uuid;
      }
      uVar5._0_4_ = pOVar4->Data1;
      uVar5._4_2_ = pOVar4->Data2;
      uVar5._6_2_ = pOVar4->Data3;
      ON_ModelComponentReference::~ON_ModelComponentReference(&cr);
    }
  }
  OVar6.Data4[0] = auVar3[0];
  OVar6.Data4[1] = auVar3[1];
  OVar6.Data4[2] = auVar3[2];
  OVar6.Data4[3] = auVar3[3];
  OVar6.Data4[4] = auVar3[4];
  OVar6.Data4[5] = auVar3[5];
  OVar6.Data4[6] = auVar3[6];
  OVar6.Data4[7] = auVar3[7];
  OVar6.Data1 = (uint)uVar5;
  OVar6.Data2 = SUB82(uVar5,4);
  OVar6.Data3 = SUB82(uVar5,6);
  return OVar6;
}

Assistant:

ON_UUID ONX_Model::CurrentDimensionStyleId() const
{
  const ON_UUID id = m_settings.CurrentDimensionStyleId();
  if (ON_nil_uuid == id)
    return id;
  if (id == ON_DimStyle::SystemDimstyleFromId(id).Id())
    return id;
  const ON_ModelComponentReference cr = ComponentFromId(ON_ModelComponent::Type::DimStyle,id);
  if (false == cr.IsEmpty())
    return id;
  return ON_nil_uuid;
}